

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
::find<unsigned_int>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
           *this,key_arg<unsigned_int> *key,size_t hash)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  h2_t hash_00;
  bool bVar3;
  size_t sVar4;
  pair<const_unsigned_int,_unsigned_long> *ts;
  iterator iVar5;
  uint local_84;
  EqualElement<unsigned_int> local_80;
  int local_70;
  BitMask<unsigned_int,_16,_0> local_6c;
  int i;
  BitMask<unsigned_int,_16,_0> __end4;
  BitMask<unsigned_int,_16,_0> __begin4;
  BitMask<unsigned_int,_16,_0> *__range4;
  Group g;
  probe_seq<16UL> seq;
  size_t hash_local;
  key_arg<unsigned_int> *key_local;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *this_local;
  
  probe((probe_seq<16UL> *)(g.ctrl + 1),this,hash);
  do {
    pcVar1 = this->ctrl_;
    sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1));
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)&__range4,pcVar1 + sVar4);
    hash_00 = H2(hash);
    __end4 = GroupSse2Impl::Match((GroupSse2Impl *)&__range4,hash_00);
    i = (int)BitMask<unsigned_int,_16,_0>::begin(&__end4);
    local_6c = BitMask<unsigned_int,_16,_0>::end(&__end4);
    while (bVar3 = operator!=((BitMask<unsigned_int,_16,_0> *)&i,&local_6c), bVar3) {
      local_70 = BitMask<unsigned_int,_16,_0>::operator*((BitMask<unsigned_int,_16,_0> *)&i);
      local_80.rhs = key;
      local_80.eq = eq_ref(this);
      psVar2 = this->slots_;
      sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1),(long)local_70);
      ts = hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,void>
           ::element<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>>
                     (psVar2 + sVar4);
      bVar3 = hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,void>
              ::
              apply<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>::EqualElement<unsigned_int>,std::pair<unsigned_int_const,unsigned_long>&,phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>>
                        (&local_80,ts);
      if (bVar3) {
        sVar4 = probe_seq<16UL>::offset((probe_seq<16UL> *)(g.ctrl + 1),(long)local_70);
        iVar5 = iterator_at(this,sVar4);
        return iVar5;
      }
      BitMask<unsigned_int,_16,_0>::operator++((BitMask<unsigned_int,_16,_0> *)&i);
    }
    local_84 = (uint)GroupSse2Impl::MatchEmpty((GroupSse2Impl *)&__range4);
    bVar3 = BitMask::operator_cast_to_bool((BitMask *)&local_84);
    if (bVar3) {
      iVar5 = end(this);
      return iVar5;
    }
    probe_seq<16UL>::next((probe_seq<16UL> *)(g.ctrl + 1));
  } while( true );
}

Assistant:

iterator find(const key_arg<K>& key, size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (int i : g.Match(H2(hash))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset(i)))))
                    return iterator_at(seq.offset(i));
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) 
                return end();
            seq.next();
        }
    }